

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi64 MemObjRealToInt(jx9_value *pObj)

{
  double dVar1;
  jx9_real r;
  jx9_value *pObj_local;
  
  dVar1 = (pObj->x).rVal;
  if (-9.223372036854776e+18 <= dVar1) {
    if (dVar1 <= 9.223372036854776e+18) {
      pObj_local = (jx9_value *)(long)dVar1;
    }
    else {
      pObj_local = (jx9_value *)0x8000000000000000;
    }
  }
  else {
    pObj_local = (jx9_value *)0x8000000000000000;
  }
  return (sxi64)pObj_local;
}

Assistant:

static sxi64 MemObjRealToInt(jx9_value *pObj)
{
#ifdef JX9_OMIT_FLOATING_POINT
	/* Real and 64bit integer are the same when floating point arithmetic
	 * is omitted from the build.
	 */
	return pObj->x.rVal;
#else
 /*
  ** Many compilers we encounter do not define constants for the
  ** minimum and maximum 64-bit integers, or they define them
  ** inconsistently.  And many do not understand the "LL" notation.
  ** So we define our own static constants here using nothing
  ** larger than a 32-bit integer constant.
  */
  static const sxi64 maxInt = LARGEST_INT64;
  static const sxi64 minInt = SMALLEST_INT64;
  jx9_real r = pObj->x.rVal;
  if( r<(jx9_real)minInt ){
    return minInt;
  }else if( r>(jx9_real)maxInt ){
    /* minInt is correct here - not maxInt.  It turns out that assigning
    ** a very large positive number to an integer results in a very large
    ** negative integer.  This makes no sense, but it is what x86 hardware
    ** does so for compatibility we will do the same in software. */
    return minInt;
  }else{
    return (sxi64)r;
  }
#endif
}